

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

int32_t icu_63::FixedDecimal::decimals(double n)

{
  int iVar1;
  double __x;
  double dVar2;
  int local_54;
  int local_50;
  int i;
  int numFractionDigits;
  int exponent;
  char buf [30];
  double scaledN;
  int ndigits;
  double n_local;
  
  scaledN._4_4_ = 0;
  while( true ) {
    if (3 < scaledN._4_4_) {
      memset(&numFractionDigits,0,0x1e);
      sprintf((char *)&numFractionDigits,"%1.15e",ABS(n));
      iVar1 = atoi(buf + 10);
      local_50 = 0xf;
      for (local_54 = 0x10; *(char *)((long)&numFractionDigits + (long)local_54) == '0';
          local_54 = local_54 + -1) {
        local_50 = local_50 + -1;
      }
      return local_50 - iVar1;
    }
    __x = ABS(n) * (double)*(int *)(p10 + (long)scaledN._4_4_ * 4);
    unique0x1000012c = __x;
    dVar2 = floor(__x);
    if ((__x == dVar2) && (!NAN(__x) && !NAN(dVar2))) break;
    scaledN._4_4_ = scaledN._4_4_ + 1;
  }
  return scaledN._4_4_;
}

Assistant:

int32_t FixedDecimal::decimals(double n) {
    // Count the number of decimal digits in the fraction part of the number, excluding trailing zeros.
    // fastpath the common cases, integers or fractions with 3 or fewer digits
    n = fabs(n);
    for (int ndigits=0; ndigits<=3; ndigits++) {
        double scaledN = n * p10[ndigits];
        if (scaledN == floor(scaledN)) {
            return ndigits;
        }
    }

    // Slow path, convert with sprintf, parse converted output.
    char  buf[30] = {0};
    sprintf(buf, "%1.15e", n);
    // formatted number looks like this: 1.234567890123457e-01
    int exponent = atoi(buf+18);
    int numFractionDigits = 15;
    for (int i=16; ; --i) {
        if (buf[i] != '0') {
            break;
        }
        --numFractionDigits;
    }
    numFractionDigits -= exponent;   // Fraction part of fixed point representation.
    return numFractionDigits;
}